

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::ConductorBxDF::PDF
          (ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  float fVar7;
  undefined8 in_XMM0_Qb;
  undefined1 auVar8 [16];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  float in_XMM2_Dd;
  Vector3<float> wm;
  Vector3f wo_00;
  Vector3<float> local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  Float FVar6;
  
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_38 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_34 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_30 = (float)in_XMM0_Qb;
  fStack_2c = (float)((ulong)in_XMM0_Qb >> 0x20);
  fVar7 = 0.0;
  if ((sampleFlags & Reflection) != Unset) {
    if (0.0 < wo_00.super_Tuple3<pbrt::Vector3,_float>.z * wi.super_Tuple3<pbrt::Vector3,_float>.z)
    {
      auVar8 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                          ZEXT416((uint)(this->mfDistrib).alpha_x));
      fVar7 = 0.0;
      if (0.001 <= auVar8._0_4_) {
        auVar8._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.x + local_38;
        auVar8._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y + fStack_34;
        auVar8._8_4_ = fStack_30 + 0.0;
        auVar8._12_4_ = in_XMM2_Dd + fStack_2c;
        local_48.super_Tuple3<pbrt::Vector3,_float>.z =
             wi.super_Tuple3<pbrt::Vector3,_float>.z + wo_00.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar1 = vmovlps_avx(auVar8);
        local_48.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
        local_48.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar5 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg,CONCAT44(in_register_00000034,mode));
          if (iVar5 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        *(long *)(in_FS_OFFSET + -0x1a8) = *(long *)(in_FS_OFFSET + -0x1a8) + 1;
        auVar11._0_4_ =
             local_48.super_Tuple3<pbrt::Vector3,_float>.y *
             local_48.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar11._4_4_ =
             local_48.super_Tuple3<pbrt::Vector3,_float>.z *
             local_48.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._8_8_ = 0;
        auVar8 = vmovshdup_avx(auVar11);
        fVar7 = local_48.super_Tuple3<pbrt::Vector3,_float>.x *
                local_48.super_Tuple3<pbrt::Vector3,_float>.x + auVar11._0_4_ + auVar8._0_4_;
        if ((fVar7 == 0.0) && (!NAN(fVar7))) {
          *(long *)(in_FS_OFFSET + -0x1b0) = *(long *)(in_FS_OFFSET + -0x1b0) + 1;
        }
        if (PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
            ::reg == '\0') {
          iVar5 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                       ::reg);
          if (iVar5 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::reg,const::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                       (PixelAccumFunc)0x0);
            __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                 ::reg);
          }
        }
        auVar3._4_4_ = fStack_34;
        auVar3._0_4_ = local_38;
        auVar3._8_4_ = fStack_30;
        auVar3._12_4_ = fStack_2c;
        *(long *)(in_FS_OFFSET + -0x198) = *(long *)(in_FS_OFFSET + -0x198) + 1;
        local_28 = vmovshdup_avx(auVar3);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_28._0_4_ *
                                               local_48.super_Tuple3<pbrt::Vector3,_float>.y)),
                                 auVar3,ZEXT416((uint)local_48.super_Tuple3<pbrt::Vector3,_float>.x)
                                );
        auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_48.super_Tuple3<pbrt::Vector3,_float>.z)
                                 ,ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z));
        fVar7 = 0.0;
        auVar10 = ZEXT856(0);
        if (auVar8._0_4_ < 0.0) {
          *(long *)(in_FS_OFFSET + -0x1a0) = *(long *)(in_FS_OFFSET + -0x1a0) + 1;
        }
        fVar2 = local_48.super_Tuple3<pbrt::Vector3,_float>.x *
                local_48.super_Tuple3<pbrt::Vector3,_float>.x +
                local_48.super_Tuple3<pbrt::Vector3,_float>.y *
                local_48.super_Tuple3<pbrt::Vector3,_float>.y +
                local_48.super_Tuple3<pbrt::Vector3,_float>.z *
                local_48.super_Tuple3<pbrt::Vector3,_float>.z;
        if (((fVar2 != 0.0) || (NAN(fVar2))) && (0.0 < auVar8._0_4_)) {
          wm = Normalize<float>(&local_48);
          local_48.super_Tuple3<pbrt::Vector3,_float>.z = wm.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar9._0_8_ = wm.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar9._8_56_ = auVar10;
          uVar1 = vmovlps_avx(auVar9._0_16_);
          local_48.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
          local_48.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
          wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_34;
          wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_38;
          FVar6 = TrowbridgeReitzDistribution::PDF
                            (&this->mfDistrib,wo_00,(Vector3f)wm.super_Tuple3<pbrt::Vector3,_float>)
          ;
          auVar4._4_4_ = fStack_34;
          auVar4._0_4_ = local_38;
          auVar4._8_4_ = fStack_30;
          auVar4._12_4_ = fStack_2c;
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)((float)local_28._0_4_ *
                                                 local_48.super_Tuple3<pbrt::Vector3,_float>.y)),
                                   auVar4,ZEXT416((uint)local_48.super_Tuple3<pbrt::Vector3,_float>.
                                                        x));
          auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)wo_00.super_Tuple3<pbrt::Vector3,_float>.z),
                                   ZEXT416((uint)local_48.super_Tuple3<pbrt::Vector3,_float>.z));
          fVar7 = FVar6 / (auVar8._0_4_ * 4.0);
        }
      }
    }
  }
  return fVar7;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        if (!SameHemisphere(wo, wi))
            return 0;
        if (mfDistrib.EffectivelySmooth())
            return 0;
        // Return PDF for sampling Torrance--Sparrow conductor BRDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);
        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh));
    }